

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void Z80::OpCode_RL(void)

{
  bool bVar1;
  char cVar2;
  Z80Reg ZVar3;
  Z80Reg ZVar4;
  int local_48;
  int iStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  
  do {
    local_48 = -1;
    iStack_44 = -1;
    uStack_40 = 0xffffffffffffffff;
    local_38 = 0xffffffffffffffff;
    ZVar3 = OpCode_CbFamily(0x10,&local_48,true);
    if (((uint)ZVar3 < 0x31) && ((0x1000100010000U >> ((ulong)(uint)ZVar3 & 0x3f) & 1) != 0)) {
      bVar1 = Options::noFakes(true);
      if (!bVar1) {
        uStack_40 = 0xcbfffffffe;
        local_48 = 0xcb;
        ZVar4 = GetRegister_r16Low(ZVar3);
        iStack_44 = ZVar4 + Z80_BC;
        ZVar3 = GetRegister_r16High(ZVar3);
        local_38 = CONCAT44(local_38._4_4_,ZVar3 + Z80_BC);
      }
    }
    EmitBytes(&local_48,true);
    cVar2 = (*DAT_0018a520)(&lp);
  } while (cVar2 != '\0');
  return;
}

Assistant:

static void OpCode_RL() {
		Z80Reg reg;
		do {
			int e[] { -1, -1, -1, -1, -1, -1 };
			switch (reg = OpCode_CbFamily(0x10, e)) {
			case Z80_A:		break;			// fully processed by the helper function
			case Z80_BC:	case Z80_DE:	case Z80_HL:
				if (Options::noFakes()) break;
				e[2] = INSTRUCTION_START_MARKER;
				e[0] = e[3] = 0xcb;
				e[1] = 0x10 + GetRegister_r16Low(reg);
				e[4] = 0x10 + GetRegister_r16High(reg);
				break;
			default:		break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}